

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

char * __thiscall cmSourceFile::GetProperty(cmSourceFile *this,string *prop)

{
  __type _Var1;
  bool chain_00;
  ulong uVar2;
  cmMakefile *this_00;
  cmState *this_01;
  bool chain;
  cmMakefile *mf;
  char *retVal;
  string *prop_local;
  cmSourceFile *this_local;
  
  _Var1 = std::operator==(prop,&propLOCATION_abi_cxx11_);
  if (_Var1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_local = (cmSourceFile *)std::__cxx11::string::c_str();
    }
    else {
      this_local = (cmSourceFile *)0x0;
    }
  }
  else {
    this_local = (cmSourceFile *)cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if (this_local == (cmSourceFile *)0x0) {
      this_00 = cmSourceFileLocation::GetMakefile(&this->Location);
      this_01 = cmMakefile::GetState(this_00);
      chain_00 = cmState::IsPropertyChained(this_01,prop,SOURCE_FILE);
      if (chain_00) {
        this_local = (cmSourceFile *)cmMakefile::GetProperty(this_00,prop,chain_00);
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmSourceFile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  if (prop == propLOCATION) {
    if (this->FullPath.empty()) {
      return nullptr;
    }
    return this->FullPath.c_str();
  }

  const char* retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    cmMakefile const* mf = this->Location.GetMakefile();
    const bool chain =
      mf->GetState()->IsPropertyChained(prop, cmProperty::SOURCE_FILE);
    if (chain) {
      return mf->GetProperty(prop, chain);
    }
  }

  return retVal;
}